

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O3

void clock_unset(_clock *x)

{
  _clock *p_Var1;
  _clock **pp_Var2;
  _clock *p_Var3;
  
  if (0.0 <= x->c_settime) {
    p_Var1 = pd_maininstance.pd_clock_setlist;
    if (pd_maininstance.pd_clock_setlist == x) {
      pp_Var2 = &pd_maininstance.pd_clock_setlist;
    }
    else {
      do {
        p_Var3 = p_Var1;
        p_Var1 = p_Var3->c_next;
      } while (p_Var1 != x);
      pp_Var2 = &p_Var3->c_next;
    }
    *pp_Var2 = x->c_next;
    x->c_settime = -1.0;
  }
  return;
}

Assistant:

void clock_unset(t_clock *x)
{
    if (x->c_settime >= 0)
    {
        if (x == pd_this->pd_clock_setlist)
            pd_this->pd_clock_setlist = x->c_next;
        else
        {
            t_clock *x2 = pd_this->pd_clock_setlist;
            while (x2->c_next != x) x2 = x2->c_next;
            x2->c_next = x->c_next;
        }
        x->c_settime = -1;
    }
}